

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# manifest_file.cpp
# Opt level: O0

void GetExtensionProperties
               (vector<ExtensionListing,_std::allocator<ExtensionListing>_> *extensions,
               vector<XrExtensionProperties,_std::allocator<XrExtensionProperties>_> *props)

{
  uint uVar1;
  bool bVar2;
  iterator __first;
  iterator __last;
  pointer pXVar3;
  uint *puVar4;
  char *__src;
  undefined1 local_f8 [8];
  XrExtensionProperties prop;
  __normal_iterator<XrExtensionProperties_*,_std::vector<XrExtensionProperties,_std::allocator<XrExtensionProperties>_>_>
  local_40;
  __normal_iterator<XrExtensionProperties_*,_std::vector<XrExtensionProperties,_std::allocator<XrExtensionProperties>_>_>
  it;
  ExtensionListing *ext;
  const_iterator __end1;
  const_iterator __begin1;
  vector<ExtensionListing,_std::allocator<ExtensionListing>_> *__range1;
  vector<XrExtensionProperties,_std::allocator<XrExtensionProperties>_> *props_local;
  vector<ExtensionListing,_std::allocator<ExtensionListing>_> *extensions_local;
  
  __end1 = std::vector<ExtensionListing,_std::allocator<ExtensionListing>_>::begin(extensions);
  ext = (ExtensionListing *)
        std::vector<ExtensionListing,_std::allocator<ExtensionListing>_>::end(extensions);
  while( true ) {
    bVar2 = __gnu_cxx::operator!=
                      (&__end1,(__normal_iterator<const_ExtensionListing_*,_std::vector<ExtensionListing,_std::allocator<ExtensionListing>_>_>
                                *)&ext);
    if (!bVar2) break;
    it._M_current =
         (XrExtensionProperties *)
         __gnu_cxx::
         __normal_iterator<const_ExtensionListing_*,_std::vector<ExtensionListing,_std::allocator<ExtensionListing>_>_>
         ::operator*(&__end1);
    __first = std::vector<XrExtensionProperties,_std::allocator<XrExtensionProperties>_>::begin
                        (props);
    __last = std::vector<XrExtensionProperties,_std::allocator<XrExtensionProperties>_>::end(props);
    local_40 = std::
               find_if<__gnu_cxx::__normal_iterator<XrExtensionProperties*,std::vector<XrExtensionProperties,std::allocator<XrExtensionProperties>>>,GetExtensionProperties(std::vector<ExtensionListing,std::allocator<ExtensionListing>>const&,std::vector<XrExtensionProperties,std::allocator<XrExtensionProperties>>&)::__0>
                         (__first._M_current,__last._M_current,it._M_current);
    prop._144_8_ = std::vector<XrExtensionProperties,_std::allocator<XrExtensionProperties>_>::end
                             (props);
    bVar2 = __gnu_cxx::operator!=
                      (&local_40,
                       (__normal_iterator<XrExtensionProperties_*,_std::vector<XrExtensionProperties,_std::allocator<XrExtensionProperties>_>_>
                        *)&prop.extensionVersion);
    if (bVar2) {
      pXVar3 = __gnu_cxx::
               __normal_iterator<XrExtensionProperties_*,_std::vector<XrExtensionProperties,_std::allocator<XrExtensionProperties>_>_>
               ::operator->(&local_40);
      puVar4 = std::max<unsigned_int>
                         (&pXVar3->extensionVersion,(uint *)((it._M_current)->extensionName + 0x10))
      ;
      uVar1 = *puVar4;
      pXVar3 = __gnu_cxx::
               __normal_iterator<XrExtensionProperties_*,_std::vector<XrExtensionProperties,_std::allocator<XrExtensionProperties>_>_>
               ::operator->(&local_40);
      pXVar3->extensionVersion = uVar1;
    }
    else {
      memset(local_f8,0,0x98);
      local_f8._0_4_ = XR_TYPE_EXTENSION_PROPERTIES;
      __src = (char *)std::__cxx11::string::c_str();
      strncpy((char *)&prop.next,__src,0x7f);
      prop.extensionName[0x77] = '\0';
      prop.extensionName._120_4_ = *(undefined4 *)((it._M_current)->extensionName + 0x10);
      std::vector<XrExtensionProperties,_std::allocator<XrExtensionProperties>_>::push_back
                (props,(value_type *)local_f8);
    }
    __gnu_cxx::
    __normal_iterator<const_ExtensionListing_*,_std::vector<ExtensionListing,_std::allocator<ExtensionListing>_>_>
    ::operator++(&__end1);
  }
  return;
}

Assistant:

static void GetExtensionProperties(const std::vector<ExtensionListing> &extensions, std::vector<XrExtensionProperties> &props) {
    for (const auto &ext : extensions) {
        auto it =
            std::find_if(props.begin(), props.end(), [&](XrExtensionProperties &prop) { return prop.extensionName == ext.name; });
        if (it != props.end()) {
            it->extensionVersion = std::max(it->extensionVersion, ext.extension_version);
        } else {
            XrExtensionProperties prop{};
            prop.type = XR_TYPE_EXTENSION_PROPERTIES;
            strncpy(prop.extensionName, ext.name.c_str(), XR_MAX_EXTENSION_NAME_SIZE - 1);
            prop.extensionName[XR_MAX_EXTENSION_NAME_SIZE - 1] = '\0';
            prop.extensionVersion = ext.extension_version;
            props.push_back(prop);
        }
    }
}